

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModelPrivate::columnsAboutToBeInserted
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *this_00;
  QItemSelection *this_01;
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  iterator pos;
  iterator iVar5;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_02;
  long in_FS_OFFSET;
  QModelIndex local_e0;
  QItemSelectionRange local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a8;
  QItemSelectionRange local_98;
  QModelIndex local_88;
  QModelIndex local_70;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  finalize(this);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QItemSelectionRange *)0x0;
  local_58.size = 0;
  this_01 = &this->ranges;
  pos = QList<QItemSelectionRange>::begin(&this_01->super_QList<QItemSelectionRange>);
  this_02 = &this->model;
  do {
    while( true ) {
      iVar5 = QList<QItemSelectionRange>::end(&this_01->super_QList<QItemSelectionRange>);
      if (pos.i == iVar5.i) {
        QList<QItemSelectionRange>::append
                  (&this_01->super_QList<QItemSelectionRange>,
                   (QList<QItemSelectionRange> *)&local_58);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return;
        }
        __stack_chk_fail();
      }
      QPersistentModelIndex::parent(&local_70,&(pos.i)->tl);
      bVar2 = QItemSelectionRange::isValid(pos.i);
      if (bVar2) break;
LAB_00401a72:
      pos.i = pos.i + 1;
    }
    bVar2 = ::comparesEqual(&local_70,parent);
    if (!bVar2) goto LAB_00401a72;
    iVar3 = QPersistentModelIndex::column(&(pos.i)->tl);
    if (start <= iVar3) goto LAB_00401a72;
    this_00 = &(pos.i)->br;
    iVar3 = QPersistentModelIndex::column(this_00);
    if (iVar3 < start) goto LAB_00401a72;
    local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_02);
    pQVar1 = (this_02->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar4 = QPersistentModelIndex::row(this_00);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (&local_88,pQVar1,(ulong)uVar4,(ulong)(start - 1),&local_70);
    local_98.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&(pos.i)->tl);
    QItemSelectionRange::QItemSelectionRange(&local_98,(QModelIndex *)&local_b8,&local_88);
    local_a8.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_02);
    pQVar1 = (this_02->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar4 = QPersistentModelIndex::row(&(pos.i)->tl);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              ((QModelIndex *)&local_b8,pQVar1,(ulong)uVar4,(ulong)(uint)start,&local_70);
    local_c8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
    QItemSelectionRange::QItemSelectionRange(&local_c8,(QModelIndex *)&local_b8,&local_e0);
    pos = QList<QItemSelectionRange>::erase(&this_01->super_QList<QItemSelectionRange>,pos.i);
    QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
              ((QList<QItemSelectionRange> *)&local_58,&local_98);
    QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
              ((QList<QItemSelectionRange> *)&local_58,&local_c8);
    QItemSelectionRange::~QItemSelectionRange(&local_c8);
    QItemSelectionRange::~QItemSelectionRange(&local_98);
  } while( true );
}

Assistant:

void QItemSelectionModelPrivate::columnsAboutToBeInserted(const QModelIndex &parent,
                                                             int start, int end)
{
    Q_UNUSED(end);
    finalize();
    QList<QItemSelectionRange> split;
    QList<QItemSelectionRange>::iterator it = ranges.begin();
    for (; it != ranges.end(); ) {
        const QModelIndex &itParent = it->parent();
        if ((*it).isValid() && itParent == parent
            && (*it).left() < start && (*it).right() >= start) {
            QModelIndex bottomMiddle = model->index((*it).bottom(), start - 1, itParent);
            QItemSelectionRange left((*it).topLeft(), bottomMiddle);
            QModelIndex topMiddle = model->index((*it).top(), start, itParent);
            QItemSelectionRange right(topMiddle, (*it).bottomRight());
            it = ranges.erase(it);
            split.append(left);
            split.append(right);
        } else {
            ++it;
        }
    }
    ranges += split;
}